

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  string *__v;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  undefined1 local_78 [40];
  string local_50;
  
  this_00 = dependee_name->Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    this_01 = (this->Targets).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_start[depender_index];
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((TVar2 != EXECUTABLE) ||
       (bVar1 = cmGeneratorTarget::IsExecutableWithExports(this_00), bVar1)) {
      local_78._0_8_ = (pointer)(local_78 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
      AddInterfaceDepends(this,depender_index,this_00,(string *)local_78,emitted);
      if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      local_78._0_8_ = (string *)0x0;
      local_78._8_8_ = (string *)0x0;
      local_78._16_8_ = (pointer)0x0;
      cmMakefile::GetConfigurations
                (&local_50,this_01->Makefile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,true);
      config = (string *)local_78._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        config = (string *)local_78._0_8_;
      }
      for (; config != (string *)local_78._8_8_; config = config + 1) {
        __v = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)emitted,__v);
        AddInterfaceDepends(this,depender_index,this_00,config,emitted);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(int depender_index,
                                             cmLinkItem const& dependee_name,
                                             std::set<std::string> &emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmGeneratorTarget const* dependee = dependee_name.Target;
  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(dependee &&
     dependee->GetType() == cmState::EXECUTABLE &&
     !dependee->IsExecutableWithExports())
    {
    dependee = 0;
    }

  if(dependee)
    {
    this->AddInterfaceDepends(depender_index, dependee, "", emitted);
    std::vector<std::string> configs;
    depender->Makefile->GetConfigurations(configs);
    for (std::vector<std::string>::const_iterator it = configs.begin();
      it != configs.end(); ++it)
      {
      // A target should not depend on itself.
      emitted.insert(depender->GetName());
      this->AddInterfaceDepends(depender_index, dependee, *it, emitted);
      }
    }
}